

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_atexit.c
# Opt level: O0

void zt_atexit(_func_void_void_ptr *fn,void *data)

{
  int iVar1;
  zt_elist_t *nlist;
  zt_elist_t *in_RSI;
  zt_elist *in_RDI;
  zt_atexit_cb *cb;
  size_t in_stack_ffffffffffffffe8;
  
  nlist = (zt_elist_t *)zt_calloc_p((size_t)in_RSI,in_stack_ffffffffffffffe8);
  iVar1 = zt_elist_empty(&cb_stack);
  if (iVar1 != 0) {
    atexit(_atexit_call);
  }
  nlist[1].prev = in_RDI;
  nlist[1].next = in_RSI;
  zt_elist_add(in_RSI,nlist);
  return;
}

Assistant:

void
zt_atexit(void (*fn)(void * data), void * data) {
    struct zt_atexit_cb * cb;

    zt_assert(fn);

    cb = zt_calloc(struct zt_atexit_cb, 1);

    if(zt_stack_empty(&cb_stack)) {
        atexit(_atexit_call);
    }

    cb->fn = fn;
    cb->data = data;

    zt_stack_push(&cb_stack, &cb->member);
}